

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O0

void __thiscall
glslang::TParseContext::checkAndResizeMeshViewDim
          (TParseContext *this,TSourceLoc *loc,TType *type,bool isBlockMember)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  int local_3c;
  int viewDimSize;
  int viewDim;
  int maxViewCount;
  bool isBlockMember_local;
  TType *type_local;
  TSourceLoc *loc_local;
  TParseContext *this_local;
  
  iVar2 = (*type->_vptr_TType[10])();
  bVar1 = TQualifier::isPerView((TQualifier *)CONCAT44(extraout_var,iVar2));
  if (bVar1) {
    if (((isBlockMember) && (uVar3 = (*type->_vptr_TType[0x1d])(), (uVar3 & 1) != 0)) ||
       ((!isBlockMember && (bVar1 = TType::isArrayOfArrays(type), bVar1)))) {
      if (((this->super_TParseContextBase).parsingBuiltins & 1U) == 0) {
        local_3c = (this->resources).maxMeshViewCountNV;
      }
      else {
        local_3c = 4;
      }
      iVar2 = (*type->_vptr_TType[0x14])();
      iVar2 = TArraySizes::getDimSize
                        ((TArraySizes *)CONCAT44(extraout_var_00,iVar2),(uint)!isBlockMember);
      if ((iVar2 == 0) || (iVar2 == local_3c)) {
        if (iVar2 == 0) {
          iVar2 = (*type->_vptr_TType[0x14])();
          TArraySizes::setDimSize
                    ((TArraySizes *)CONCAT44(extraout_var_01,iVar2),(uint)!isBlockMember,local_3c);
        }
      }
      else {
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,loc,
                   "mesh view output array size must be gl_MaxMeshViewCountNV or implicitly sized",
                   "[]","");
      }
    }
    else {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"requires a view array dimension","perviewNV","");
    }
  }
  return;
}

Assistant:

void TParseContext::checkAndResizeMeshViewDim(const TSourceLoc& loc, TType& type, bool isBlockMember)
{
    // see if member is a per-view attribute
    if (!type.getQualifier().isPerView())
        return;

    if ((isBlockMember && type.isArray()) || (!isBlockMember && type.isArrayOfArrays())) {
        // since we don't have the maxMeshViewCountNV set during parsing builtins, we hardcode the value.
        int maxViewCount = parsingBuiltins ? 4 : resources.maxMeshViewCountNV;
        // For block members, outermost array dimension is the view dimension.
        // For non-block members, outermost array dimension is the vertex/primitive dimension
        // and 2nd outermost is the view dimension.
        int viewDim = isBlockMember ? 0 : 1;
        int viewDimSize = type.getArraySizes()->getDimSize(viewDim);

        if (viewDimSize != UnsizedArraySize && viewDimSize != maxViewCount)
            error(loc, "mesh view output array size must be gl_MaxMeshViewCountNV or implicitly sized", "[]", "");
        else if (viewDimSize == UnsizedArraySize)
            type.getArraySizes()->setDimSize(viewDim, maxViewCount);
    }
    else {
        error(loc, "requires a view array dimension", "perviewNV", "");
    }
}